

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O0

Error __thiscall asmjit::CodeBuilder::onDetach(CodeBuilder *this,CodeHolder *code)

{
  Error EVar1;
  CodeHolder *in_RSI;
  CodeEmitter *in_RDI;
  Zone *unaff_retaddr;
  char **this_00;
  bool releaseMemory;
  
  this_00 = &in_RDI[2]._inlineComment;
  *this_00 = (char *)0x0;
  in_RDI[2]._none.field_0._packed[0] = (UInt64)0x0;
  in_RDI[2]._none.field_0._mem.field_2.offset64 = 0;
  in_RDI[2]._nativeGpReg.super_Operand.super_Operand_.field_0._packed[0] = (UInt64)0x0;
  in_RDI[2]._nativeGpReg.super_Operand.super_Operand_.field_0._mem.field_2.offset64 = 0;
  in_RDI[2]._nativeGpArray = (Reg *)0x0;
  ZoneHeap::reset((ZoneHeap *)this_00,(Zone *)&in_RDI[2]._nativeGpReg);
  releaseMemory = SUB81((ulong)this_00 >> 0x38,0);
  Zone::reset(unaff_retaddr,releaseMemory);
  Zone::reset(unaff_retaddr,releaseMemory);
  Zone::reset(unaff_retaddr,releaseMemory);
  *(undefined4 *)&in_RDI[3]._code = 0;
  *(undefined4 *)((long)&in_RDI[3]._code + 4) = 0;
  in_RDI[3]._vptr_CodeEmitter = (_func_int **)0x0;
  in_RDI[3]._codeInfo._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
  in_RDI[3]._codeInfo.field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
  in_RDI[3]._codeInfo._baseAddress = 0;
  EVar1 = CodeEmitter::onDetach(in_RDI,in_RSI);
  return EVar1;
}

Assistant:

Error CodeBuilder::onDetach(CodeHolder* code) noexcept {
  _cbPasses.reset();
  _cbLabels.reset();
  _cbHeap.reset(&_cbBaseZone);

  _cbBaseZone.reset(false);
  _cbDataZone.reset(false);
  _cbPassZone.reset(false);

  _position = 0;
  _nodeFlags = 0;

  _firstNode = nullptr;
  _lastNode = nullptr;
  _cursor = nullptr;

  return Base::onDetach(code);
}